

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Buffers::ClearTest::LogError
          (ClearTest *this,bool use_sub_data,GLenum internalformat)

{
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  MessageBuilder local_1d0;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string the_log;
  GLenum internalformat_local;
  bool use_sub_data_local;
  ClearTest *this_local;
  
  the_log.field_2._8_4_ = internalformat;
  the_log.field_2._M_local_buf[0xf] = use_sub_data;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"Unexpected error occurred during Test of ",&local_39);
  std::allocator<char>::~allocator(&local_39);
  if ((the_log.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::append(local_38);
  }
  else {
    std::__cxx11::string::append(local_38);
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ClearTest::LogError(bool use_sub_data, glw::GLenum internalformat)
{
	(void)internalformat;
	std::string the_log = "Unexpected error occurred during Test of ";

	if (use_sub_data)
	{
		the_log.append("ClearNamedBufferSubData with internalformat ");
	}
	else
	{
		the_log.append("ClearNamedBufferData with internalformat ");
	}

	//the_log.append(glu::getPixelFormatName(internalformat));

	m_context.getTestContext().getLog() << tcu::TestLog::Message << the_log << tcu::TestLog::EndMessage;
}